

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int pem_des3_decrypt(uchar *des3_iv,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  uchar des3_key [24];
  mbedtls_des3_context des3_ctx;
  uchar auStack_1c8 [24];
  mbedtls_des3_context local_1b0;
  
  mbedtls_des3_init(&local_1b0);
  iVar1 = pem_pbkdf1(auStack_1c8,0x18,des3_iv,pwd,pwdlen);
  if (iVar1 == 0) {
    iVar1 = mbedtls_des3_set3key_dec(&local_1b0,auStack_1c8);
    if (iVar1 == 0) {
      iVar1 = mbedtls_des3_crypt_cbc(&local_1b0,0,buflen,des3_iv,buf,buf);
    }
  }
  mbedtls_des3_free(&local_1b0);
  mbedtls_platform_zeroize(auStack_1c8,0x18);
  return iVar1;
}

Assistant:

static int pem_des3_decrypt( unsigned char des3_iv[8],
                             unsigned char *buf, size_t buflen,
                             const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_des3_context des3_ctx;
    unsigned char des3_key[24];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_des3_init( &des3_ctx );

    if( ( ret = pem_pbkdf1( des3_key, 24, des3_iv, pwd, pwdlen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_des3_set3key_dec( &des3_ctx, des3_key ) ) != 0 )
        goto exit;
    ret = mbedtls_des3_crypt_cbc( &des3_ctx, MBEDTLS_DES_DECRYPT, buflen,
                     des3_iv, buf, buf );

exit:
    mbedtls_des3_free( &des3_ctx );
    mbedtls_platform_zeroize( des3_key, 24 );

    return( ret );
}